

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varmap.cc
# Opt level: O0

void __thiscall
MapState::addGuard(MapState *this,LoadGuard *guard,OpCode opc,TypeFactory *typeFactory)

{
  bool bVar1;
  type_metatype tVar2;
  int4 iVar3;
  PcodeOp *pPVar4;
  Varnode *pVVar5;
  uintb uVar6;
  uintb st;
  uintb uVar7;
  int local_3c;
  int4 minItems;
  int4 outSize;
  Datatype *ct;
  int4 step;
  TypeFactory *typeFactory_local;
  OpCode opc_local;
  LoadGuard *guard_local;
  MapState *this_local;
  
  bVar1 = LoadGuard::isValid(guard,opc);
  if ((bVar1) && (ct._4_4_ = LoadGuard::getStep(guard), ct._4_4_ != 0)) {
    pPVar4 = LoadGuard::getOp(guard);
    pVVar5 = PcodeOp::getIn(pPVar4,1);
    _minItems = (TypeArray *)Varnode::getType(pVVar5);
    tVar2 = Datatype::getMetatype((Datatype *)_minItems);
    if (tVar2 == TYPE_PTR) {
      _minItems = (TypeArray *)TypePointer::getPtrTo((TypePointer *)_minItems);
      while (tVar2 = Datatype::getMetatype(&_minItems->super_Datatype), tVar2 == TYPE_ARRAY) {
        _minItems = (TypeArray *)TypeArray::getBase(_minItems);
      }
    }
    if (opc == CPUI_STORE) {
      pPVar4 = LoadGuard::getOp(guard);
      pVVar5 = PcodeOp::getIn(pPVar4,2);
      local_3c = Varnode::getSize(pVVar5);
    }
    else {
      pPVar4 = LoadGuard::getOp(guard);
      pVVar5 = PcodeOp::getOut(pPVar4);
      local_3c = Varnode::getSize(pVVar5);
    }
    if (local_3c != ct._4_4_) {
      if (ct._4_4_ < local_3c) {
        return;
      }
      if (ct._4_4_ % local_3c != 0) {
        return;
      }
      ct._4_4_ = local_3c;
    }
    iVar3 = Datatype::getSize(&_minItems->super_Datatype);
    if (iVar3 != ct._4_4_) {
      if (8 < ct._4_4_) {
        return;
      }
      _minItems = (TypeArray *)TypeFactory::getBase(typeFactory,ct._4_4_,TYPE_UNKNOWN);
    }
    bVar1 = LoadGuard::isRangeLocked(guard);
    if (bVar1) {
      uVar7 = LoadGuard::getMaximum(guard);
      uVar6 = LoadGuard::getMinimum(guard);
      st = LoadGuard::getMinimum(guard);
      addRange(this,st,&_minItems->super_Datatype,0,open,
               (int)(((uVar7 - uVar6) + 1) / (ulong)(long)ct._4_4_) + -1);
    }
    else {
      uVar7 = LoadGuard::getMinimum(guard);
      addRange(this,uVar7,&_minItems->super_Datatype,0,open,3);
    }
  }
  return;
}

Assistant:

void MapState::addGuard(const LoadGuard &guard,OpCode opc,TypeFactory *typeFactory)

{
  if (!guard.isValid(opc)) return;
  int4 step = guard.getStep();
  if (step == 0) return;		// No definitive sign of array access
  Datatype *ct = guard.getOp()->getIn(1)->getType();
  if (ct->getMetatype() == TYPE_PTR) {
    ct = ((TypePointer *) ct)->getPtrTo();
    while (ct->getMetatype() == TYPE_ARRAY)
      ct = ((TypeArray *) ct)->getBase();
  }
  int4 outSize;
  if (opc == CPUI_STORE)
    outSize = guard.getOp()->getIn(2)->getSize();	// The Varnode being stored
  else
    outSize = guard.getOp()->getOut()->getSize();	// The Varnode being loaded
  if (outSize != step) {
    // LOAD size doesn't match step:  field in array of structures or something more unusual
    if (outSize > step || (step % outSize) != 0)
      return;
    // Since the LOAD size divides the step and we want to preserve the arrayness
    // we pretend we have an array of LOAD's size
    step = outSize;
  }
  if (ct->getSize() != step) {	// Make sure data-type matches our step size
    if (step > 8)
      return;		// Don't manufacture primitives bigger than 8-bytes
    ct = typeFactory->getBase(step, TYPE_UNKNOWN);
  }
  if (guard.isRangeLocked()) {
    int4 minItems = ((guard.getMaximum() - guard.getMinimum()) + 1) / step;
    addRange(guard.getMinimum(),ct,0,RangeHint::open,minItems-1);
  }
  else
    addRange(guard.getMinimum(),ct,0,RangeHint::open,3);
}